

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

char * Bbl_ManFileRead(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  char *__ptr;
  int RetValue;
  int nFileSize;
  char *pContents;
  FILE *pFile;
  char *pFileName_local;
  
  iVar1 = Bbl_ManFileSize(pFileName);
  __stream = fopen(pFileName,"rb");
  __ptr = (char *)malloc((long)iVar1);
  fread(__ptr,(long)iVar1,1,__stream);
  fclose(__stream);
  return __ptr;
}

Assistant:

char * Bbl_ManFileRead( char * pFileName )
{
    FILE * pFile;
    char * pContents;
    int nFileSize;
    int RetValue;
    nFileSize = Bbl_ManFileSize( pFileName );
    pFile = fopen( pFileName, "rb" );
    pContents = BBLIF_ALLOC( char, nFileSize );
    RetValue = fread( pContents, nFileSize, 1, pFile );
    fclose( pFile );
    return pContents;
}